

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len)

{
  char *__s;
  ushort uVar1;
  bool bVar2;
  byte bVar3;
  short sVar4;
  wchar_t wVar6;
  int iVar7;
  byte bVar8;
  short sVar9;
  ulong uVar10;
  byte *p;
  int16_t tmp;
  byte *pbVar11;
  bool bVar12;
  short sVar5;
  
  uVar1 = *(ushort *)ext;
  ext[4] = ext[4] & 0xf9;
  __s = ext + 5;
  sVar4 = 0;
  memset(__s,0,(ulong)(uVar1 + 1 >> 1));
  if (len != 0) {
    do {
      wVar6 = utf8_ptr::s_getch(str);
      if ((0x7f < (uint)wVar6) || (iVar7 = isspace(wVar6), iVar7 == 0)) {
        wVar6 = utf8_ptr::s_getch(str);
        bVar8 = 0;
        if (wVar6 == L'+') {
LAB_00269d2c:
          len = (size_t)((byte *)str +
                        (len - (long)((byte *)str +
                                     (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                            (uint)((byte)*str >> 7) * 3) + 1)));
          str = (char *)((byte *)str +
                        (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1)
          ;
        }
        else {
          wVar6 = utf8_ptr::s_getch(str);
          bVar8 = 1;
          if (wVar6 == L'-') goto LAB_00269d2c;
          bVar8 = 0;
        }
        ext[4] = ext[4] & 0xfeU | bVar8;
        if ((byte *)len != (byte *)0x0) goto LAB_00269d6c;
        sVar4 = 0;
        goto LAB_00269e82;
      }
      len = (size_t)((byte *)str +
                    (len - (long)((byte *)str +
                                 (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                        (uint)((byte)*str >> 7) * 3) + 1)));
      str = (char *)((byte *)str +
                    (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
    } while ((byte *)len != (byte *)0x0);
  }
  ext[4] = ext[4] & 0xfe;
  goto LAB_00269e82;
  while( true ) {
    sVar4 = 0;
    len = (size_t)((byte *)str +
                  (len - (long)((byte *)str +
                               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*str >> 7) * 3) + 1)));
    str = (char *)((byte *)str +
                  (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
    if ((byte *)len == (byte *)0x0) break;
LAB_00269d6c:
    wVar6 = utf8_ptr::s_getch(str);
    if ((0x7f < (uint)wVar6) || (iVar7 = isspace(wVar6), iVar7 == 0)) {
      sVar4 = 0;
      uVar10 = 0;
      bVar8 = 0;
      bVar12 = false;
      goto LAB_00269dc1;
    }
  }
  goto LAB_00269e82;
  while( true ) {
    len = (size_t)((byte *)str +
                  (len - (long)((byte *)str +
                               (ulong)((((byte)*str >> 5 & 1) != 0) + 1 &
                                      (uint)((byte)*str >> 7) * 3) + 1)));
    str = (char *)((byte *)str +
                  (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1);
    if ((byte *)len == (byte *)0x0) break;
LAB_00269dc1:
    wVar6 = utf8_ptr::s_getch(str);
    if ((uint)(wVar6 + L'\xffffffc6') < 0xfffffff6) {
      bVar2 = (bool)(wVar6 != L'.' | bVar8);
      bVar8 = 1;
      if (bVar2) {
        if ((wVar6 & 0xffffffdfU) == 0x45) {
          p = (byte *)str +
              (ulong)((((byte)*str >> 5 & 1) != 0) + 1 & (uint)((byte)*str >> 7) * 3) + 1;
          pbVar11 = (byte *)str + (len - (long)p);
          sVar5 = 0;
          if (pbVar11 == (byte *)0x0) goto LAB_00269f75;
          wVar6 = utf8_ptr::s_getch((char *)p);
          bVar12 = wVar6 == L'+';
          if ((bVar12) || (wVar6 = utf8_ptr::s_getch((char *)p), wVar6 == L'-')) {
            sVar9 = 0;
            p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
            pbVar11 = (byte *)str + (len - (long)p);
            if (pbVar11 == (byte *)0x0) goto LAB_00269f6b;
          }
          else {
            bVar12 = true;
          }
          iVar7 = 0;
          goto LAB_00269f29;
        }
        break;
      }
    }
    else if (wVar6 != L'0' || bVar12) {
      if (uVar10 < uVar1) {
        bVar3 = (byte)uVar10 & 1;
        __s[uVar10 >> 1] =
             (byte)((wVar6 & 0xfU) << (bVar3 * '\x04' ^ 4)) |
             '\x0f' << (bVar3 << 2) & __s[uVar10 >> 1];
        uVar10 = uVar10 + 1;
      }
      sVar4 = sVar4 + (ushort)(byte)~bVar8;
      bVar12 = true;
    }
    else {
      sVar4 = sVar4 - (ushort)bVar8;
      bVar12 = false;
    }
  }
  goto LAB_00269e82;
  while( true ) {
    iVar7 = wVar6 + L'\xffffffd0' + iVar7 * 10;
    sVar9 = (short)iVar7;
    pbVar11 = p + ((long)pbVar11 -
                  (long)(p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1));
    p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
    if (pbVar11 == (byte *)0x0) break;
LAB_00269f29:
    sVar9 = (short)iVar7;
    wVar6 = utf8_ptr::s_getch((char *)p);
    if (9 < (uint)(wVar6 + L'\xffffffd0')) break;
  }
LAB_00269f6b:
  sVar5 = -sVar9;
  if (bVar12) {
    sVar5 = sVar9;
  }
LAB_00269f75:
  sVar4 = sVar5 + sVar4;
LAB_00269e82:
  *(short *)(ext + 2) = sVar4;
  normalize(ext);
  return;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len)
{
    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the type to number */
    set_type(ext, VMBN_T_NUM);

    /* initially zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* initialize the exponent to zero */
    int exp = 0;

    /* presume it will be positive */
    int neg = FALSE;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* set the sign */
    set_neg(ext, neg);

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* we haven't yet found a significant digit */
    int significant = FALSE;

    /* shift the digits into the value */
    int pt = FALSE;
    for (size_t idx = 0 ; rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;

        /* get this character */
        ch = p.getch();

        /* check for a digit */
        if (is_digit(ch))
        {
            /* 
             *   if it's not a zero, we're definitely into the significant
             *   part of the number 
             */
            if (ch != '0')
                significant = TRUE;

            /* 
             *   if it's significant, add it to the number - skip leading
             *   zeros, since they add no information to the number 
             */
            if (significant)
            {
                /* if we're not out of precision, add the digit */
                if (idx < prec)
                {
                    /* set the next digit */
                    set_dig(ext, idx, value_of_digit(ch));

                    /* move on to the next digit position */
                    ++idx;
                }

                /* 
                 *   that's another factor of 10 if we haven't found the
                 *   decimal point (whether or not we're out of precision to
                 *   actually store the digit, count the increase in the
                 *   exponent) 
                 */
                if (!pt)
                    ++exp;
            }
            else if (pt)
            {
                /* 
                 *   we haven't yet found a significant digit, so this is a
                 *   leading zero, but we have found the decimal point - this
                 *   reduces the exponent by one 
                 */
                --exp;
            }
        }
        else if (ch == '.' && !pt)
        {
            /* 
             *   this is the decimal point - note it; from now on, we won't
             *   increase the exponent as we add digits 
             */
            pt = TRUE;
        }
        else if (ch == 'e' || ch == 'E')
        {
            int acc;
            int exp_neg = FALSE;

            /* exponent - skip the 'e' */
            p.inc(&rem);

            /* check for a sign */
            if (rem != 0 && p.getch() == '+')
            {
                /* skip the sign */
                p.inc(&rem);
            }
            else if (rem != 0 && p.getch() == '-')
            {
                /* skip it and note it */
                p.inc(&rem);
                exp_neg = TRUE;
            }

            /* parse the exponent */
            for (acc = 0 ; rem != 0 ; p.inc(&rem))
            {
                wchar_t ch;

                /* if this is a digit, add it to the exponent */
                ch = p.getch();
                if (is_digit(ch))
                {
                    /* accumulate the digit */
                    acc *= 10;
                    acc += value_of_digit(ch);
                }
                else
                {
                    /* that's it for the exponent */
                    break;
                }
            }

            /* if it's negative, apply the sign */
            if (exp_neg)
                acc = -acc;

            /* add the exponent to the one we've calculated */
            exp += acc;

            /* after the exponent, we're done with the whole number */
            break;
        }
        else
        {
            /* it looks like we've reached the end of the number */
            break;
        }
    }

    /* set the exponent */
    set_exp(ext, exp);

    /* normalize the number */
    normalize(ext);
}